

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

size_t zmCreateCrand_deep(size_t no)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t n;
  size_t in_stack_ffffffffffffffe0;
  
  sVar1 = zmMulCrand_deep(in_stack_ffffffffffffffe0);
  sVar2 = zmSqrCrand_deep(in_stack_ffffffffffffffe0);
  sVar3 = zmInv_deep(0x199556);
  sVar4 = zmDiv_deep(0x199565);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  return sVar1;
}

Assistant:

size_t zmCreateCrand_deep(size_t no)
{
	const size_t n = W_OF_O(no);
	return utilMax(4,
		zmMulCrand_deep(n),
		zmSqrCrand_deep(n),
		zmInv_deep(n),
		zmDiv_deep(n));
}